

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

Logger * Logger::Instance(void)

{
  int iVar1;
  allocator local_29;
  string local_28;
  
  if (Instance()::logger == '\0') {
    iVar1 = __cxa_guard_acquire(&Instance()::logger);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_28,"Verlauf.log",&local_29);
      Logger(&Instance::logger,&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::allocator<char>::~allocator((allocator<char> *)&local_29);
      __cxa_atexit(~Logger,&Instance::logger,&__dso_handle);
      __cxa_guard_release(&Instance()::logger);
    }
  }
  return &Instance::logger;
}

Assistant:

Logger &Logger::Instance() {
    static Logger logger;

    return logger;
}